

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_recovery.cpp
# Opt level: O2

void __thiscall
RecoveryTest_PureVirtualMethodCallTest_Test::~RecoveryTest_PureVirtualMethodCallTest_Test
          (RecoveryTest_PureVirtualMethodCallTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (RecoveryTest, PureVirtualMethodCallTest) {
#ifdef _WIN32
    const char regex[] = "::PureCallHandler";
#else
    const char regex[] = "PosixCrashHandler::handleCrash";
#endif
    
    ASSERT_EXIT(Derived(), ::extensions::ExitedOrKilled(CHILLOUT_EXIT_CODE, SIGSEGV), regex);
}